

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O2

bool __thiscall Kumu::MemIOReader::ReadUi32BE(MemIOReader *this,ui32_t *i)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  if (i != (ui32_t *)0x0) {
    uVar2 = *(uint *)(this + 8);
    uVar1 = (ulong)*(uint *)(this + 0xc) + 4;
    if (uVar1 <= uVar2) {
      uVar3 = *(uint *)(*(long *)this + (ulong)*(uint *)(this + 0xc));
      *i = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(int *)(this + 0xc) = *(int *)(this + 0xc) + 4;
    }
    return uVar1 <= uVar2;
  }
  __assert_fail("i",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                ,0xc4,"bool Kumu::MemIOReader::ReadUi32BE(ui32_t *)");
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }